

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::OneofDescriptor>
                   (string *__return_storage_ptr__,OneofDescriptor *descriptor)

{
  bool bVar1;
  reference piVar2;
  FileDescriptor *this;
  string *psVar3;
  uint32_t *puVar4;
  Arena *pAVar5;
  iterator iStack_a8;
  int index;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  Annotation annotation;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> path;
  OneofDescriptor *descriptor_local;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)descriptor;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  OneofDescriptor::GetLocationPath
            ((OneofDescriptor *)
             path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)&__range4);
  __end4 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_40);
  iStack_a8 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff58);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end4);
    GeneratedCodeInfo_Annotation::add_path((GeneratedCodeInfo_Annotation *)&__range4,*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end4);
  }
  this = OneofDescriptor::file
                   ((OneofDescriptor *)
                    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  psVar3 = FileDescriptor::name_abi_cxx11_(this);
  puVar4 = internal::HasBits<1UL>::operator[]
                     ((HasBits<1UL> *)
                      &annotation.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar4 = (byte)*puVar4 | 1;
  pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)&__range4);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)&annotation._path_cached_byte_size_,psVar3,pAVar5)
  ;
  MessageLite::SerializeAsString_abi_cxx11_(__return_storage_ptr__,(MessageLite *)&__range4);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)&__range4);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int index : path) {
      annotation.add_path(index);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }